

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_183a0ec::HandleGlobalMode
               (cmExecutionStatus *status,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names,string *propertyName,string *propertyValue,bool appendAsString,bool appendMode
               ,bool remove)

{
  size_t sVar1;
  cmake *this;
  long *local_50 [2];
  long local_40 [2];
  
  sVar1 = (names->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 == 0) {
    this = cmMakefile::GetCMakeInstance(status->Makefile);
    if (appendMode) {
      cmake::AppendProperty(this,propertyName,propertyValue,appendAsString);
    }
    else {
      if (remove) {
        propertyValue = (string *)0x0;
      }
      cmake::SetProperty(this,propertyName,(cmValue)propertyValue);
    }
  }
  else {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"given names for GLOBAL scope.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  return sVar1 == 0;
}

Assistant:

bool HandleGlobalMode(cmExecutionStatus& status,
                      const std::set<std::string>& names,
                      const std::string& propertyName,
                      const std::string& propertyValue, bool appendAsString,
                      bool appendMode, bool remove)
{
  if (!names.empty()) {
    status.SetError("given names for GLOBAL scope.");
    return false;
  }

  // Set or append the property.
  cmake* cm = status.GetMakefile().GetCMakeInstance();
  if (appendMode) {
    cm->AppendProperty(propertyName, propertyValue, appendAsString);
  } else {
    if (remove) {
      cm->SetProperty(propertyName, nullptr);
    } else {
      cm->SetProperty(propertyName, propertyValue);
    }
  }

  return true;
}